

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

bool __thiscall QSslSocket::waitForConnected(QSslSocket *this,int msecs)

{
  long lVar1;
  byte bVar2;
  QSslSocketPrivate *this_00;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  bool retVal;
  QSslSocketPrivate *d;
  SocketState in_stack_ffffffffffffff9c;
  QAbstractSocket *in_stack_ffffffffffffffa0;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSslSocket *)0x3a2aae);
  if (this_00->plainSocket == (QTcpSocket *)0x0) {
    local_21 = false;
  }
  else {
    bVar2 = (**(code **)(*(long *)&this_00->plainSocket->super_QAbstractSocket + 0x130))
                      (this_00->plainSocket,in_ESI);
    local_21 = (bool)(bVar2 & 1);
    if (local_21 == false) {
      QAbstractSocket::state((QAbstractSocket *)0x3a2b03);
      QAbstractSocket::setSocketState(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      QAbstractSocket::error((QAbstractSocket *)0x3a2b2a);
      QIODevice::errorString();
      QAbstractSocketPrivate::setError
                ((QAbstractSocketPrivate *)this_00,in_stack_ffffffffffffff9c,(QString *)0x3a2b57);
      QString::~QString((QString *)0x3a2b61);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool QSslSocket::waitForConnected(int msecs)
{
    Q_D(QSslSocket);
    if (!d->plainSocket)
        return false;
    bool retVal = d->plainSocket->waitForConnected(msecs);
    if (!retVal) {
        setSocketState(d->plainSocket->state());
        d->setError(d->plainSocket->error(), d->plainSocket->errorString());
    }
    return retVal;
}